

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa_asn1.cc
# Opt level: O0

int rsa_priv_decode(EVP_PKEY *out,CBS *params,CBS *key)

{
  int iVar1;
  size_t sVar2;
  RSA *key_00;
  RSA *rsa;
  CBS null;
  CBS *key_local;
  CBS *params_local;
  EVP_PKEY *out_local;
  
  null.len = (size_t)key;
  iVar1 = CBS_get_asn1(params,(CBS *)&rsa,5);
  if (((iVar1 != 0) && (sVar2 = CBS_len((CBS *)&rsa), sVar2 == 0)) &&
     (sVar2 = CBS_len(params), sVar2 == 0)) {
    key_00 = RSA_parse_private_key((CBS *)null.len);
    if ((key_00 != (RSA *)0x0) && (sVar2 = CBS_len((CBS *)null.len), sVar2 == 0)) {
      EVP_PKEY_assign_RSA(out,key_00);
      return 1;
    }
    ERR_put_error(6,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa_asn1.cc"
                  ,0x6b);
    RSA_free((RSA *)key_00);
    return 0;
  }
  ERR_put_error(6,0,0x66,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_rsa_asn1.cc"
                ,0x65);
  return 0;
}

Assistant:

static int rsa_priv_decode(EVP_PKEY *out, CBS *params, CBS *key) {
  // Per RFC 3447, A.1, the parameters have type NULL.
  CBS null;
  if (!CBS_get_asn1(params, &null, CBS_ASN1_NULL) || CBS_len(&null) != 0 ||
      CBS_len(params) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    return 0;
  }

  RSA *rsa = RSA_parse_private_key(key);
  if (rsa == NULL || CBS_len(key) != 0) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_DECODE_ERROR);
    RSA_free(rsa);
    return 0;
  }

  EVP_PKEY_assign_RSA(out, rsa);
  return 1;
}